

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall fmp4_stream::media_fragment::parse_moof(media_fragment *this)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 local_108;
  undefined1 local_104;
  allocator local_101;
  media_fragment *local_100;
  long local_f8;
  tfhd *local_f0;
  tfdt *local_e8;
  trun *local_e0;
  pointer local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->moof_box_).size_ != 0) {
    puVar4 = (this->moof_box_).box_data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_f0 = &this->tfhd_;
    local_e8 = &this->tfdt_;
    local_e0 = &this->trun_;
    local_100 = this;
    local_d8 = puVar4;
    for (uVar6 = 8; puVar2 = local_d8,
        uVar6 < (ulong)((long)(local_100->moof_box_).box_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar4);
        uVar6 = uVar6 + uVar5) {
      uVar1 = *(uint *)(puVar4 + uVar6);
      local_108 = *(undefined4 *)(local_d8 + uVar6 + 4);
      local_104 = 0;
      if (uVar1 == 0x1000000) {
        uVar5 = *(ulong *)(local_d8 + uVar6 + 8);
        uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 |
                uVar5 << 0x38;
        local_f8 = 8;
      }
      else {
        uVar5 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                       uVar1 << 0x18);
        local_f8 = 0;
      }
      std::__cxx11::string::string((string *)&local_50,"mfhd",&local_101);
      bVar3 = f_compare_4cc((char *)&local_108,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar3) {
        uVar1 = *(uint *)(puVar2 + local_f8 + uVar6 + 0xc);
        *(uint *)&(local_100->mfhd_).super_full_box.field_0x6c =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      }
      else {
        std::__cxx11::string::string((string *)&local_70,"trun",&local_101);
        bVar3 = f_compare_4cc((char *)&local_108,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        if (bVar3) {
          trun::parse(local_e0,(char *)(puVar2 + local_f8 + uVar6));
        }
        else {
          std::__cxx11::string::string((string *)&local_90,"tfdt",&local_101);
          bVar3 = f_compare_4cc((char *)&local_108,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          if (bVar3) {
            tfdt::parse(local_e8,(char *)(puVar2 + local_f8 + uVar6));
          }
          else {
            std::__cxx11::string::string((string *)&local_b0,"tfhd",&local_101);
            bVar3 = f_compare_4cc((char *)&local_108,&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            if (bVar3) {
              tfhd::parse(local_f0,(char *)(puVar2 + local_f8 + uVar6));
            }
            else {
              std::__cxx11::string::string((string *)&local_d0,"traf",&local_101);
              bVar3 = f_compare_4cc((char *)&local_108,&local_d0);
              std::__cxx11::string::~string((string *)&local_d0);
              uVar5 = uVar5 & 0xffffffff;
              if (bVar3) {
                uVar5 = 8;
              }
            }
          }
        }
      }
      puVar4 = (local_100->moof_box_).box_data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  return;
}

Assistant:

void media_fragment::parse_moof()
	{
		if (!moof_box_.size_)
			return;

		uint64_t box_size = 0;
		uint64_t offset = 8;
		uint8_t * ptr = &moof_box_.box_data_[0];

		while (moof_box_.box_data_.size() > offset)
		{
			unsigned int temp_off = 0;
			box_size = (uint64_t)fmp4_read_uint32((char *)&moof_box_.box_data_[offset]);

			char name[5] = { (char)ptr[offset + 4],(char)ptr[offset + 5],(char)ptr[offset + 6],(char)ptr[offset + 7],'\0' };

			if (box_size == 1) // the box_size is a large size (should not happen in fmp4)
			{
				temp_off = 8;
				box_size = fmp4_read_uint64((char *)& ptr[offset + temp_off]);
			}

			if (f_compare_4cc(name,"mfhd"))
			{
				mfhd_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				//cout << "mfhd size" << box_size << endl;
				continue;
			}

			if (f_compare_4cc(name,"trun"))
			{
				trun_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			if (f_compare_4cc(name,"tfdt"))
			{
				tfdt_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			if (f_compare_4cc(name,"tfhd"))
			{
				tfhd_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			// cmaf style only one traf box per moof so we skip it
			if (f_compare_4cc(name, "traf"))
			{
				offset += 8;
			}
			else
				offset += (unsigned int)box_size;
		}
	}